

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RemoveUnusedBrs.cpp
# Opt level: O0

void __thiscall wasm::RemoveUnusedBrs::optimizeSwitch(RemoveUnusedBrs *this,Switch *curr)

{
  Expression *pEVar1;
  bool bVar2;
  Index IVar3;
  IString *pIVar4;
  size_t sVar5;
  Name *pNVar6;
  Name *this_00;
  Module *pMVar7;
  Const *pCVar8;
  Binary *pBVar9;
  Drop *left;
  Break *pBVar10;
  Block *expression;
  Break *pBVar11;
  If *pIVar12;
  PassRunner *pPVar13;
  ulong uVar14;
  Function *func;
  LocalSet *condition;
  LocalGet *left_00;
  optional<wasm::Type> type;
  optional<wasm::Type> type_00;
  optional<wasm::Type> type_01;
  optional<wasm::Type> type_02;
  bool local_142;
  bool local_141;
  optional<wasm::Type> local_130;
  size_t local_120;
  char *local_118;
  optional<wasm::Type> local_108;
  size_t local_f8;
  char *local_f0;
  size_t local_e8;
  char *local_e0;
  Type local_d8;
  Type local_d0;
  If *local_c8;
  Expression *z;
  Index local_b4;
  Index temp;
  Builder builder_3;
  Index i_1;
  bool shrink;
  uint32_t MIN_GENERAL;
  uint32_t MIN_SHRINK;
  undefined1 local_88;
  size_t local_80;
  char *local_78;
  size_t local_70;
  char *local_68;
  Builder local_60;
  Builder builder_2;
  optional<wasm::Type> local_50;
  size_t local_40;
  char *local_38;
  Builder local_30;
  Builder builder_1;
  Builder builder;
  Index i;
  Index removable;
  Switch *curr_local;
  RemoveUnusedBrs *this_local;
  
  while( true ) {
    bVar2 = ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>::empty
                      (&(curr->targets).super_ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>);
    local_141 = false;
    if (!bVar2) {
      pIVar4 = &ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>::back
                          (&(curr->targets).
                            super_ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>)->
                super_IString;
      local_141 = IString::operator==(pIVar4,&(curr->default_).super_IString);
    }
    if (local_141 == false) break;
    ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>::pop_back
              (&(curr->targets).super_ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>);
  }
  builder.wasm._4_4_ = 0;
  while( true ) {
    sVar5 = ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>::size
                      (&(curr->targets).super_ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>);
    local_142 = false;
    if (builder.wasm._4_4_ < sVar5) {
      pIVar4 = &ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>::operator[]
                          (&(curr->targets).
                            super_ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>,
                           (ulong)builder.wasm._4_4_)->super_IString;
      local_142 = IString::operator==(pIVar4,&(curr->default_).super_IString);
    }
    if (local_142 == false) break;
    builder.wasm._4_4_ = builder.wasm._4_4_ + 1;
  }
  if (builder.wasm._4_4_ != 0) {
    for (builder.wasm._0_4_ = builder.wasm._4_4_;
        sVar5 = ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>::size
                          (&(curr->targets).
                            super_ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>),
        (uint)builder.wasm < sVar5; builder.wasm._0_4_ = (uint)builder.wasm + 1) {
      pNVar6 = ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>::operator[]
                         (&(curr->targets).
                           super_ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>,
                          (ulong)(uint)builder.wasm);
      this_00 = ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>::operator[]
                          (&(curr->targets).
                            super_ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>,
                           (ulong)((uint)builder.wasm - builder.wasm._4_4_));
      wasm::Name::operator=(this_00,pNVar6);
    }
    sVar5 = ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>::size
                      (&(curr->targets).super_ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>);
    ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>::resize
              (&(curr->targets).super_ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>,
               sVar5 - builder.wasm._4_4_);
    pMVar7 = Walker<wasm::RemoveUnusedBrs,_wasm::Visitor<wasm::RemoveUnusedBrs,_void>_>::getModule
                       (&(this->
                         super_WalkerPass<wasm::PostWalker<wasm::RemoveUnusedBrs,_wasm::Visitor<wasm::RemoveUnusedBrs,_void>_>_>
                         ).
                         super_PostWalker<wasm::RemoveUnusedBrs,_wasm::Visitor<wasm::RemoveUnusedBrs,_void>_>
                         .
                         super_Walker<wasm::RemoveUnusedBrs,_wasm::Visitor<wasm::RemoveUnusedBrs,_void>_>
                       );
    Builder::Builder(&builder_1,pMVar7);
    pEVar1 = curr->condition;
    pCVar8 = Builder::makeConst<int>(&builder_1,builder.wasm._4_4_);
    pBVar9 = Builder::makeBinary(&builder_1,SubInt32,pEVar1,(Expression *)pCVar8);
    curr->condition = (Expression *)pBVar9;
  }
  if (curr->value == (Expression *)0x0) {
    sVar5 = ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>::size
                      (&(curr->targets).super_ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>);
    if (sVar5 == 0) {
      pMVar7 = Walker<wasm::RemoveUnusedBrs,_wasm::Visitor<wasm::RemoveUnusedBrs,_void>_>::getModule
                         (&(this->
                           super_WalkerPass<wasm::PostWalker<wasm::RemoveUnusedBrs,_wasm::Visitor<wasm::RemoveUnusedBrs,_void>_>_>
                           ).
                           super_PostWalker<wasm::RemoveUnusedBrs,_wasm::Visitor<wasm::RemoveUnusedBrs,_void>_>
                           .
                           super_Walker<wasm::RemoveUnusedBrs,_wasm::Visitor<wasm::RemoveUnusedBrs,_void>_>
                         );
      Builder::Builder(&local_30,pMVar7);
      left = Builder::makeDrop(&local_30,curr->condition);
      local_40 = (curr->default_).super_IString.str._M_len;
      local_38 = (curr->default_).super_IString.str._M_str;
      pBVar10 = Builder::makeBreak(&local_30,(Name)(curr->default_).super_IString.str,
                                   (Expression *)0x0,(Expression *)0x0);
      std::optional<wasm::Type>::optional(&local_50);
      type.super__Optional_base<wasm::Type,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::Type>._9_7_ = 0;
      type.super__Optional_base<wasm::Type,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::Type>._M_payload =
           local_50.super__Optional_base<wasm::Type,_true,_true>._M_payload.
           super__Optional_payload_base<wasm::Type>._M_payload;
      type.super__Optional_base<wasm::Type,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::Type>._M_engaged =
           local_50.super__Optional_base<wasm::Type,_true,_true>._M_payload.
           super__Optional_payload_base<wasm::Type>._M_engaged;
      expression = Builder::makeSequence(&local_30,(Expression *)left,(Expression *)pBVar10,type);
      Walker<wasm::RemoveUnusedBrs,_wasm::Visitor<wasm::RemoveUnusedBrs,_void>_>::replaceCurrent
                (&(this->
                  super_WalkerPass<wasm::PostWalker<wasm::RemoveUnusedBrs,_wasm::Visitor<wasm::RemoveUnusedBrs,_void>_>_>
                  ).
                  super_PostWalker<wasm::RemoveUnusedBrs,_wasm::Visitor<wasm::RemoveUnusedBrs,_void>_>
                  .super_Walker<wasm::RemoveUnusedBrs,_wasm::Visitor<wasm::RemoveUnusedBrs,_void>_>,
                 (Expression *)expression);
    }
    else {
      sVar5 = ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>::size
                        (&(curr->targets).super_ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>
                        );
      if (sVar5 == 1) {
        pMVar7 = Walker<wasm::RemoveUnusedBrs,_wasm::Visitor<wasm::RemoveUnusedBrs,_void>_>::
                 getModule(&(this->
                            super_WalkerPass<wasm::PostWalker<wasm::RemoveUnusedBrs,_wasm::Visitor<wasm::RemoveUnusedBrs,_void>_>_>
                            ).
                            super_PostWalker<wasm::RemoveUnusedBrs,_wasm::Visitor<wasm::RemoveUnusedBrs,_void>_>
                            .
                            super_Walker<wasm::RemoveUnusedBrs,_wasm::Visitor<wasm::RemoveUnusedBrs,_void>_>
                          );
        Builder::Builder(&local_60,pMVar7);
        pEVar1 = curr->condition;
        local_70 = (curr->default_).super_IString.str._M_len;
        local_68 = (curr->default_).super_IString.str._M_str;
        pBVar10 = Builder::makeBreak(&local_60,(Name)(curr->default_).super_IString.str,
                                     (Expression *)0x0,(Expression *)0x0);
        pNVar6 = ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>::front
                           (&(curr->targets).
                             super_ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>);
        local_80 = (pNVar6->super_IString).str._M_len;
        local_78 = (pNVar6->super_IString).str._M_str;
        pBVar11 = Builder::makeBreak(&local_60,(Name)(pNVar6->super_IString).str,(Expression *)0x0,
                                     (Expression *)0x0);
        std::optional<wasm::Type>::optional((optional<wasm::Type> *)&MIN_SHRINK);
        type_00.super__Optional_base<wasm::Type,_true,_true>._M_payload.
        super__Optional_payload_base<wasm::Type>._9_7_ = 0;
        type_00.super__Optional_base<wasm::Type,_true,_true>._M_payload.
        super__Optional_payload_base<wasm::Type>._M_payload =
             (_Storage<wasm::Type,_true>)_MIN_SHRINK;
        type_00.super__Optional_base<wasm::Type,_true,_true>._M_payload.
        super__Optional_payload_base<wasm::Type>._M_engaged = (bool)local_88;
        pIVar12 = Builder::makeIf(&local_60,pEVar1,(Expression *)pBVar10,(Expression *)pBVar11,
                                  type_00);
        Walker<wasm::RemoveUnusedBrs,_wasm::Visitor<wasm::RemoveUnusedBrs,_void>_>::replaceCurrent
                  (&(this->
                    super_WalkerPass<wasm::PostWalker<wasm::RemoveUnusedBrs,_wasm::Visitor<wasm::RemoveUnusedBrs,_void>_>_>
                    ).
                    super_PostWalker<wasm::RemoveUnusedBrs,_wasm::Visitor<wasm::RemoveUnusedBrs,_void>_>
                    .
                    super_Walker<wasm::RemoveUnusedBrs,_wasm::Visitor<wasm::RemoveUnusedBrs,_void>_>
                   ,(Expression *)pIVar12);
      }
      else {
        pPVar13 = Pass::getPassRunner((Pass *)this);
        bVar2 = (pPVar13->options).shrinkLevel < 1;
        sVar5 = ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>::size
                          (&(curr->targets).
                            super_ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>);
        if (((0xc < sVar5) && (!bVar2)) ||
           ((sVar5 = ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>::size
                               (&(curr->targets).
                                 super_ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>),
            0x7f < sVar5 && (bVar2)))) {
          for (builder_3.wasm._4_4_ = 1; uVar14 = (ulong)builder_3.wasm._4_4_,
              sVar5 = ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>::size
                                (&(curr->targets).
                                  super_ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>),
              uVar14 < sVar5 - 1; builder_3.wasm._4_4_ = builder_3.wasm._4_4_ + 1) {
            pIVar4 = &ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>::operator[]
                                (&(curr->targets).
                                  super_ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>,
                                 (ulong)builder_3.wasm._4_4_)->super_IString;
            bVar2 = IString::operator!=(pIVar4,&(curr->default_).super_IString);
            if (bVar2) {
              return;
            }
          }
          pMVar7 = Walker<wasm::RemoveUnusedBrs,_wasm::Visitor<wasm::RemoveUnusedBrs,_void>_>::
                   getModule(&(this->
                              super_WalkerPass<wasm::PostWalker<wasm::RemoveUnusedBrs,_wasm::Visitor<wasm::RemoveUnusedBrs,_void>_>_>
                              ).
                              super_PostWalker<wasm::RemoveUnusedBrs,_wasm::Visitor<wasm::RemoveUnusedBrs,_void>_>
                              .
                              super_Walker<wasm::RemoveUnusedBrs,_wasm::Visitor<wasm::RemoveUnusedBrs,_void>_>
                            );
          Builder::Builder((Builder *)&stack0xffffffffffffff50,pMVar7);
          func = Walker<wasm::RemoveUnusedBrs,_wasm::Visitor<wasm::RemoveUnusedBrs,_void>_>::
                 getFunction(&(this->
                              super_WalkerPass<wasm::PostWalker<wasm::RemoveUnusedBrs,_wasm::Visitor<wasm::RemoveUnusedBrs,_void>_>_>
                              ).
                              super_PostWalker<wasm::RemoveUnusedBrs,_wasm::Visitor<wasm::RemoveUnusedBrs,_void>_>
                              .
                              super_Walker<wasm::RemoveUnusedBrs,_wasm::Visitor<wasm::RemoveUnusedBrs,_void>_>
                            );
          wasm::Type::Type((Type *)&z,i32);
          IVar3 = Builder::addVar(func,(Type)z);
          pEVar1 = curr->condition;
          local_b4 = IVar3;
          wasm::Type::Type(&local_d0,i32);
          condition = Builder::makeLocalTee
                                ((Builder *)&stack0xffffffffffffff50,IVar3,pEVar1,local_d0);
          IVar3 = local_b4;
          wasm::Type::Type(&local_d8,i32);
          left_00 = Builder::makeLocalGet((Builder *)&stack0xffffffffffffff50,IVar3,local_d8);
          sVar5 = ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>::size
                            (&(curr->targets).
                              super_ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>);
          pCVar8 = Builder::makeConst<int>((Builder *)&stack0xffffffffffffff50,(int)sVar5 + -1);
          pBVar9 = Builder::makeBinary((Builder *)&stack0xffffffffffffff50,EqInt32,
                                       (Expression *)left_00,(Expression *)pCVar8);
          pNVar6 = ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>::back
                             (&(curr->targets).
                               super_ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>);
          local_e8 = (pNVar6->super_IString).str._M_len;
          local_e0 = (pNVar6->super_IString).str._M_str;
          pBVar10 = Builder::makeBreak((Builder *)&stack0xffffffffffffff50,
                                       (Name)(pNVar6->super_IString).str,(Expression *)0x0,
                                       (Expression *)0x0);
          local_f8 = (curr->default_).super_IString.str._M_len;
          local_f0 = (curr->default_).super_IString.str._M_str;
          pBVar11 = Builder::makeBreak((Builder *)&stack0xffffffffffffff50,
                                       (Name)(curr->default_).super_IString.str,(Expression *)0x0,
                                       (Expression *)0x0);
          std::optional<wasm::Type>::optional(&local_108);
          type_01.super__Optional_base<wasm::Type,_true,_true>._M_payload.
          super__Optional_payload_base<wasm::Type>._9_7_ = 0;
          type_01.super__Optional_base<wasm::Type,_true,_true>._M_payload.
          super__Optional_payload_base<wasm::Type>._M_payload =
               local_108.super__Optional_base<wasm::Type,_true,_true>._M_payload.
               super__Optional_payload_base<wasm::Type>._M_payload;
          type_01.super__Optional_base<wasm::Type,_true,_true>._M_payload.
          super__Optional_payload_base<wasm::Type>._M_engaged =
               local_108.super__Optional_base<wasm::Type,_true,_true>._M_payload.
               super__Optional_payload_base<wasm::Type>._M_engaged;
          pIVar12 = Builder::makeIf((Builder *)&stack0xffffffffffffff50,(Expression *)pBVar9,
                                    (Expression *)pBVar10,(Expression *)pBVar11,type_01);
          pNVar6 = ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>::front
                             (&(curr->targets).
                               super_ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>);
          local_120 = (pNVar6->super_IString).str._M_len;
          local_118 = (pNVar6->super_IString).str._M_str;
          pBVar10 = Builder::makeBreak((Builder *)&stack0xffffffffffffff50,
                                       (Name)(pNVar6->super_IString).str,(Expression *)0x0,
                                       (Expression *)0x0);
          std::optional<wasm::Type>::optional(&local_130);
          type_02.super__Optional_base<wasm::Type,_true,_true>._M_payload.
          super__Optional_payload_base<wasm::Type>._9_7_ = 0;
          type_02.super__Optional_base<wasm::Type,_true,_true>._M_payload.
          super__Optional_payload_base<wasm::Type>._M_payload =
               local_130.super__Optional_base<wasm::Type,_true,_true>._M_payload.
               super__Optional_payload_base<wasm::Type>._M_payload;
          type_02.super__Optional_base<wasm::Type,_true,_true>._M_payload.
          super__Optional_payload_base<wasm::Type>._M_engaged =
               local_130.super__Optional_base<wasm::Type,_true,_true>._M_payload.
               super__Optional_payload_base<wasm::Type>._M_engaged;
          local_c8 = Builder::makeIf((Builder *)&stack0xffffffffffffff50,(Expression *)condition,
                                     (Expression *)pIVar12,(Expression *)pBVar10,type_02);
          Walker<wasm::RemoveUnusedBrs,_wasm::Visitor<wasm::RemoveUnusedBrs,_void>_>::replaceCurrent
                    (&(this->
                      super_WalkerPass<wasm::PostWalker<wasm::RemoveUnusedBrs,_wasm::Visitor<wasm::RemoveUnusedBrs,_void>_>_>
                      ).
                      super_PostWalker<wasm::RemoveUnusedBrs,_wasm::Visitor<wasm::RemoveUnusedBrs,_void>_>
                      .
                      super_Walker<wasm::RemoveUnusedBrs,_wasm::Visitor<wasm::RemoveUnusedBrs,_void>_>
                     ,(Expression *)local_c8);
        }
      }
    }
  }
  return;
}

Assistant:

void optimizeSwitch(Switch* curr) {
    // if the final element is the default, we don't need it
    while (!curr->targets.empty() && curr->targets.back() == curr->default_) {
      curr->targets.pop_back();
    }
    // if the first element is the default, we can remove it by shifting
    // everything (which does add a subtraction of a constant, but often that is
    // worth it as the constant can be folded away and/or we remove multiple
    // elements here)
    Index removable = 0;
    while (removable < curr->targets.size() &&
           curr->targets[removable] == curr->default_) {
      removable++;
    }
    if (removable > 0) {
      for (Index i = removable; i < curr->targets.size(); i++) {
        curr->targets[i - removable] = curr->targets[i];
      }
      curr->targets.resize(curr->targets.size() - removable);
      Builder builder(*getModule());
      curr->condition = builder.makeBinary(
        SubInt32, curr->condition, builder.makeConst(int32_t(removable)));
    }
    // when there isn't a value, we can do some trivial optimizations without
    // worrying about the value being executed before the condition
    if (curr->value) {
      return;
    }
    if (curr->targets.size() == 0) {
      // a switch with just a default always goes there
      Builder builder(*getModule());
      replaceCurrent(builder.makeSequence(builder.makeDrop(curr->condition),
                                          builder.makeBreak(curr->default_)));
    } else if (curr->targets.size() == 1) {
      // a switch with two options is basically an if
      Builder builder(*getModule());
      replaceCurrent(builder.makeIf(curr->condition,
                                    builder.makeBreak(curr->default_),
                                    builder.makeBreak(curr->targets.front())));
    } else {
      // there are also some other cases where we want to convert a switch into
      // ifs, especially if the switch is large and we are focusing on size. an
      // especially egregious case is a switch like this: [a b b [..] b b c]
      // with default b (which may be arrived at after we trim away excess
      // default values on both sides). in this case, we really have 3 values in
      // a simple form, so it is the next logical case after handling 1 and 2
      // values right above here. to optimize this, we must add a local + a
      // bunch of nodes (if*2, tee, eq, get, const, break*3), so the table must
      // be big enough for it to make sense

      // How many targets we need when shrinking. This is literally the size at
      // which the transformation begins to be smaller.
      const uint32_t MIN_SHRINK = 13;
      // How many targets we need when not shrinking, in which case, 2 ifs may
      // be slower, so we do this when the table is ridiculously large for one
      // with just 3 values in it.
      const uint32_t MIN_GENERAL = 128;

      auto shrink = getPassRunner()->options.shrinkLevel > 0;
      if ((curr->targets.size() >= MIN_SHRINK && shrink) ||
          (curr->targets.size() >= MIN_GENERAL && !shrink)) {
        for (Index i = 1; i < curr->targets.size() - 1; i++) {
          if (curr->targets[i] != curr->default_) {
            return;
          }
        }
        // great, we are in that case, optimize
        Builder builder(*getModule());
        auto temp = builder.addVar(getFunction(), Type::i32);
        Expression* z;
        replaceCurrent(z = builder.makeIf(
                         builder.makeLocalTee(temp, curr->condition, Type::i32),
                         builder.makeIf(builder.makeBinary(
                                          EqInt32,
                                          builder.makeLocalGet(temp, Type::i32),
                                          builder.makeConst(
                                            int32_t(curr->targets.size() - 1))),
                                        builder.makeBreak(curr->targets.back()),
                                        builder.makeBreak(curr->default_)),
                         builder.makeBreak(curr->targets.front())));
      }
    }
  }